

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_fd_generic_set_nonblocking.c
# Opt level: O2

int os_fd_generic_set_nonblocking(os_fd *sock)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = fcntl(sock->fd,3);
  if (uVar1 == 0xffffffff) {
    iVar2 = -1;
  }
  else {
    iVar2 = fcntl(sock->fd,4,(ulong)(uVar1 | 0x800));
    iVar2 = iVar2 >> 0x1f;
  }
  return iVar2;
}

Assistant:

int
os_fd_generic_set_nonblocking(struct os_fd *sock) {
  int state;

  /* put socket into non-blocking mode */
  if ((state = fcntl(sock->fd, F_GETFL)) == -1) {
    return -1;
  }

  if (fcntl(sock->fd, F_SETFL, state | O_NONBLOCK) < 0) {
    return -1;
  }
  return 0;
}